

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O3

string * __thiscall
soul::convertToString_abi_cxx11_(string *__return_storage_ptr__,soul *this,IdentifierPath *name)

{
  string local_30;
  
  IdentifierPath::toString_abi_cxx11_(&local_30,(IdentifierPath *)this);
  Program::stripRootNamespaceFromQualifiedPath(__return_storage_ptr__,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string convertToString (const IdentifierPath& name)     { return Program::stripRootNamespaceFromQualifiedPath (name.toString()); }